

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelPackage.cpp
# Opt level: O3

string * __thiscall
MPL::detail::ModelPackageImpl::addItem
          (string *__return_storage_ptr__,ModelPackageImpl *this,path *path,string *name,
          string *author,string *description)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *identifier_00;
  undefined8 uVar2;
  runtime_error *this_00;
  long *plVar3;
  size_type *psVar4;
  ModelPackageImpl *pMVar5;
  string *identifier;
  path dstPath;
  path filePath;
  path local_b8;
  string *local_90;
  path local_88;
  _Alloc_hider local_60;
  undefined1 local_58 [40];
  
  pMVar5 = this;
  local_90 = __return_storage_ptr__;
  local_60._M_p = (pointer)description;
  findItem((ModelPackageImpl *)local_58,(string *)this,name);
  uVar2 = local_58._0_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
  }
  if ((pointer)uVar2 == (pointer)0x0) {
    getItemPath((path *)local_58,pMVar5,name,author);
    std::filesystem::__cxx11::operator/(&local_88,&this->m_packageDataDirPath,(path *)local_58);
    std::filesystem::__cxx11::path::parent_path();
    std::filesystem::create_directories(&local_b8);
    std::filesystem::__cxx11::path::~path(&local_b8);
    pMVar5 = (ModelPackageImpl *)&local_88;
    std::filesystem::copy(path,(path *)pMVar5,none);
    identifier_00 = local_90;
    generateIdentifier_abi_cxx11_(local_90,pMVar5);
    paVar1 = &local_b8._M_pathname.field_2;
    local_b8._M_pathname._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b8,local_58._0_8_,(pointer)(local_58._0_8_ + local_58._8_8_));
    createItemInfoEntry(this,identifier_00,&local_b8._M_pathname,name,author,(string *)local_60._M_p
                       );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_pathname._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_pathname._M_dataplus._M_p,
                      local_b8._M_pathname.field_2._M_allocated_capacity + 1);
    }
    std::filesystem::__cxx11::path::~path(&local_88);
    std::filesystem::__cxx11::path::~path((path *)local_58);
    return identifier_00;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_b8._M_pathname,"The package already contains a file with name: ",name);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_b8);
  local_88._M_pathname._M_dataplus._M_p = (pointer)*plVar3;
  psVar4 = (size_type *)(plVar3 + 2);
  if ((size_type *)local_88._M_pathname._M_dataplus._M_p == psVar4) {
    local_88._M_pathname.field_2._M_allocated_capacity = *psVar4;
    local_88._M_pathname.field_2._8_8_ = plVar3[3];
    local_88._M_pathname._M_dataplus._M_p = (pointer)&local_88._M_pathname.field_2;
  }
  else {
    local_88._M_pathname.field_2._M_allocated_capacity = *psVar4;
  }
  local_88._M_pathname._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                 &local_88._M_pathname,author);
  std::runtime_error::runtime_error(this_00,(string *)local_58);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::string ModelPackageImpl::addItem(const std::filesystem::path& path, const std::string& name, const std::string& author, const std::string& description)
{
    if (findItem(name, author) != nullptr) {
        throw std::runtime_error("The package already contains a file with name: " + name + " author: " + author);
    }
    
    auto filePath = getItemPath(name, author);
    auto dstPath = m_packageDataDirPath / filePath;
    
    create_directories(dstPath.parent_path());
    std::filesystem::copy(path, dstPath);
    
    auto identifier = generateIdentifier();
    createItemInfoEntry(identifier, filePath.string(), name, author, description);
    return identifier;
}